

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

Mode __thiscall
Catch::Clara::Parser::handleOpt
          (Parser *this,size_t i,char c,string *arg,
          vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *tokens)

{
  long lVar1;
  undefined7 in_register_00000011;
  ulong uVar2;
  string optName;
  undefined1 local_78 [8];
  _Alloc_hider local_70;
  undefined4 local_68 [6];
  string local_50 [32];
  
  local_78 = (undefined1  [8])local_68;
  local_68[0] = 0x3d3a;
  local_70._M_p = (pointer)0x3;
  lVar1 = std::__cxx11::string::find
                    ((char)(string *)local_78,CONCAT71(in_register_00000011,c) & 0xffffffff);
  std::__cxx11::string::~string((string *)local_78);
  if (lVar1 == -1) {
    return this->mode;
  }
  std::__cxx11::string::substr((ulong)&optName,(ulong)arg);
  if (this->mode == SlashOpt) {
    if (optName._M_string_length != 1) goto LAB_0014c499;
    local_78._0_4_ = 1;
    std::__cxx11::string::string((string *)&local_70,(string *)&optName);
    std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::
    emplace_back<Catch::Clara::Parser::Token>(tokens,(Token *)local_78);
  }
  else {
    if (this->mode == ShortOpt) {
      for (uVar2 = 0; uVar2 < optName._M_string_length; uVar2 = uVar2 + 1) {
        std::__cxx11::string::substr((ulong)local_50,(ulong)&optName);
        local_78._0_4_ = 1;
        std::__cxx11::string::string((string *)&local_70,local_50);
        std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::
        emplace_back<Catch::Clara::Parser::Token>(tokens,(Token *)local_78);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string(local_50);
      }
      goto LAB_0014c4c6;
    }
LAB_0014c499:
    local_78._0_4_ = 2;
    std::__cxx11::string::string((string *)&local_70,(string *)&optName);
    std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::
    emplace_back<Catch::Clara::Parser::Token>(tokens,(Token *)local_78);
  }
  std::__cxx11::string::~string((string *)&local_70);
LAB_0014c4c6:
  std::__cxx11::string::~string((string *)&optName);
  return None;
}

Assistant:

Mode handleOpt( std::size_t i, char c, std::string const& arg, std::vector<Token>& tokens ) {
            if( std::string( ":=\0", 3 ).find( c ) == std::string::npos )
                return mode;

            std::string optName = arg.substr( from, i-from );
            if( mode == ShortOpt )
                for( std::size_t j = 0; j < optName.size(); ++j )
                    tokens.push_back( Token( Token::ShortOpt, optName.substr( j, 1 ) ) );
            else if( mode == SlashOpt && optName.size() == 1 )
                tokens.push_back( Token( Token::ShortOpt, optName ) );
            else
                tokens.push_back( Token( Token::LongOpt, optName ) );
            return None;
        }